

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O1

Path * __thiscall tinyusdz::Path::get_parent_path(Path *__return_storage_ptr__,Path *this)

{
  long lVar1;
  char *__end;
  string local_70;
  string local_50;
  
  if (this->_valid == false) {
LAB_0028dbf4:
    (__return_storage_ptr__->_prim_part)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_prim_part).field_2;
    (__return_storage_ptr__->_prim_part)._M_string_length = 0;
    (__return_storage_ptr__->_prim_part).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_prop_part)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_prop_part).field_2;
    (__return_storage_ptr__->_prop_part)._M_string_length = 0;
    (__return_storage_ptr__->_prop_part).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_variant_part)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_variant_part).field_2;
    (__return_storage_ptr__->_variant_part)._M_string_length = 0;
    (__return_storage_ptr__->_variant_part).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_variant_selection_part)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_variant_selection_part).field_2;
    (__return_storage_ptr__->_variant_selection_part)._M_string_length = 0;
    (__return_storage_ptr__->_variant_selection_part).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_variant_part_str)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_variant_part_str).field_2;
    (__return_storage_ptr__->_variant_part_str)._M_string_length = 0;
    (__return_storage_ptr__->_variant_part_str).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_element)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_element).field_2;
    (__return_storage_ptr__->_element)._M_string_length = 0;
    (__return_storage_ptr__->_element).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_path_type).has_value_ = false;
    (__return_storage_ptr__->_path_type).contained = (storage_t<tinyusdz::Path::PathType>)0x0;
    __return_storage_ptr__->_valid = false;
    return __return_storage_ptr__;
  }
  if (((this->_prim_part)._M_string_length == 1) && (*(this->_prim_part)._M_dataplus._M_p == '/')) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"","");
    Path(__return_storage_ptr__,&local_70,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    if (((this->_prim_part)._M_string_length == 0) || ((this->_prop_part)._M_string_length == 0)) {
      lVar1 = ::std::__cxx11::string::rfind((char)this,0x2f);
      if (lVar1 != 0) {
        if (lVar1 == -1) goto LAB_0028dbf4;
        ::std::__cxx11::string::substr((ulong)&local_70,(ulong)this);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
        Path(__return_storage_ptr__,&local_70,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == &local_70.field_2) {
          return __return_storage_ptr__;
        }
        goto LAB_0028dcf1;
      }
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"/","");
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
      Path(__return_storage_ptr__,&local_70,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
      Path(__return_storage_ptr__,(string *)this,&local_70);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return __return_storage_ptr__;
    }
  }
LAB_0028dcf1:
  operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

Path Path::get_parent_path() const {
  if (!_valid) {
    return Path();
  }

  if (is_root_path()) {
    Path p("", "");
    return p;
  }

  if (is_prim_property_path()) {
    // return prim part
    return Path(prim_part(), "");
  }

  size_t n = _prim_part.find_last_of('/');
  if (n == std::string::npos) {
    // relative path(e.g. "bora") or propery only path(e.g. ".myval").
    return Path();
  }

  if (n == 0) {
    // return root
    return Path("/", "");
  }

  return Path(_prim_part.substr(0, n), "");
}